

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O0

maybe<unsigned_int,_void> * __thiscall
pstore::maybe<unsigned_int,void>::operator=(maybe<unsigned_int,void> *this,uint *other)

{
  uint *__a;
  uint local_1c;
  uint *puStack_18;
  uint temp;
  uint *other_local;
  maybe<unsigned_int,_void> *this_local;
  
  if (((byte)*this & 1) == 0) {
    *(uint *)(this + 4) = *other;
    *this = (maybe<unsigned_int,void>)0x1;
  }
  else {
    local_1c = *other;
    puStack_18 = other;
    other_local = (uint *)this;
    __a = maybe<unsigned_int,_void>::value((maybe<unsigned_int,_void> *)this);
    std::swap<unsigned_int>(__a,&local_1c);
  }
  return (maybe<unsigned_int,_void> *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }